

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svectorbase.h
# Opt level: O1

void __thiscall
soplex::
SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::sort(SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  long lVar15;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar16;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar17;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar18;
  long lVar19;
  long lVar20;
  
  pNVar16 = this->m_elem;
  if (pNVar16 !=
      (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       *)0x0) {
    if (1 < (long)this->memused) {
      pNVar17 = pNVar16 + this->memused;
      pNVar18 = pNVar16 + 1;
      lVar19 = 0;
      do {
        if (pNVar16[1].idx < pNVar16->idx) {
          uVar7 = *(undefined8 *)((pNVar18->val).m_backend.data._M_elems + 8);
          uVar8 = *(undefined8 *)(pNVar18->val).m_backend.data._M_elems;
          uVar9 = *(undefined8 *)((pNVar18->val).m_backend.data._M_elems + 2);
          uVar10 = *(undefined8 *)((pNVar18->val).m_backend.data._M_elems + 4);
          uVar11 = *(undefined8 *)((pNVar18->val).m_backend.data._M_elems + 6);
          iVar5 = pNVar16[1].val.m_backend.exp;
          bVar4 = pNVar16[1].val.m_backend.neg;
          uVar3 = *(undefined8 *)&pNVar16[1].val.m_backend.fpclass;
          iVar6 = pNVar16[1].idx;
          lVar15 = 0;
          do {
            lVar20 = lVar15;
            *(undefined8 *)((long)pNVar16[1].val.m_backend.data._M_elems + lVar20 + 0x20) =
                 *(undefined8 *)((long)(pNVar16->val).m_backend.data._M_elems + lVar20 + 0x20);
            puVar1 = (undefined8 *)((long)(pNVar16->val).m_backend.data._M_elems + lVar20);
            uVar12 = *puVar1;
            uVar13 = puVar1[1];
            puVar1 = (undefined8 *)((long)(pNVar16->val).m_backend.data._M_elems + lVar20 + 0x10);
            uVar14 = puVar1[1];
            puVar2 = (undefined8 *)((long)pNVar16[1].val.m_backend.data._M_elems + lVar20 + 0x10);
            *puVar2 = *puVar1;
            puVar2[1] = uVar14;
            puVar1 = (undefined8 *)((long)pNVar16[1].val.m_backend.data._M_elems + lVar20);
            *puVar1 = uVar12;
            puVar1[1] = uVar13;
            *(undefined4 *)((long)(&pNVar16[1].val.m_backend.data + 1) + lVar20) =
                 *(undefined4 *)((long)(&(pNVar16->val).m_backend.data + 1) + lVar20);
            *(undefined1 *)((long)(&pNVar16[1].val.m_backend.data + 1) + lVar20 + 4) =
                 *(undefined1 *)((long)(&(pNVar16->val).m_backend.data + 1) + lVar20 + 4);
            *(undefined8 *)((long)(&pNVar16[1].val.m_backend.data + 1) + lVar20 + 8) =
                 *(undefined8 *)((long)(&(pNVar16->val).m_backend.data + 1) + lVar20 + 8);
            *(undefined4 *)((long)(&pNVar16[1].val + 1) + lVar20) =
                 *(undefined4 *)((long)(&pNVar16->val + 1) + lVar20);
            if (lVar19 == lVar20) break;
            lVar15 = lVar20 + -0x3c;
          } while (iVar6 < *(int *)((long)(pNVar16->val).m_backend.data._M_elems + lVar20 + -4));
          *(undefined8 *)((long)(pNVar16->val).m_backend.data._M_elems + lVar20 + 0x20) = uVar7;
          puVar1 = (undefined8 *)((long)(pNVar16->val).m_backend.data._M_elems + lVar20 + 0x10);
          *puVar1 = uVar10;
          puVar1[1] = uVar11;
          puVar1 = (undefined8 *)((long)(pNVar16->val).m_backend.data._M_elems + lVar20);
          *puVar1 = uVar8;
          puVar1[1] = uVar9;
          *(int *)((long)(&(pNVar16->val).m_backend.data + 1) + lVar20) = iVar5;
          *(bool *)((long)(&(pNVar16->val).m_backend.data + 1) + lVar20 + 4) = bVar4;
          *(undefined8 *)((long)(&(pNVar16->val).m_backend.data + 1) + lVar20 + 8) = uVar3;
          *(int *)((long)(&pNVar16->val + 1) + lVar20) = iVar6;
        }
        pNVar18 = pNVar18 + 1;
        pNVar16 = pNVar16 + 1;
        lVar19 = lVar19 + -0x3c;
      } while (pNVar18 < pNVar17);
    }
  }
  return;
}

Assistant:

void sort()
   {
      if(m_elem != nullptr)
      {
         Nonzero<R> dummy;
         Nonzero<R>* w;
         Nonzero<R>* l;
         Nonzero<R>* s = &(m_elem[0]);
         Nonzero<R>* e = s + size();

         for(l = s, w = s + 1; w < e; l = w, ++w)
         {
            if(l->idx > w->idx)
            {
               dummy = *w;

               do
               {
                  l[1] = *l;

                  if(l-- == s)
                     break;
               }
               while(l->idx > dummy.idx);

               l[1] = dummy;
            }
         }
      }
   }